

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O1

time_t Convert(time_t Month,time_t Day,time_t Year,time_t Hours,time_t Minutes,time_t Seconds,
              time_t Timezone,DSTMODE DSTmode)

{
  long lVar1;
  ulong uVar2;
  tm *ptVar3;
  byte bVar4;
  ulong uVar5;
  tm tmbuf;
  long local_58;
  char local_50 [2];
  undefined6 uStack_4e;
  undefined4 local_48;
  tm local_40;
  
  local_48 = 0x1f1e1f1e;
  uVar5 = Year + 0x76c;
  if (99 < Year) {
    uVar5 = Year;
  }
  if (Year < 0x45) {
    uVar5 = Year + 2000;
  }
  bVar4 = 0x1c;
  if ((uVar5 & 3) == 0) {
    lVar1 = uVar5 * -0x70a3d70a3d70a3d7;
    bVar4 = 0x1d;
    if ((lVar1 + 0x51eb851eb851eb8U >> 2 | lVar1 << 0x3e) < 0x28f5c28f5c28f5d) {
      bVar4 = (lVar1 + 0x51eb851eb851eb0U >> 4 | lVar1 << 0x3c) < 0xa3d70a3d70a3d7 | 0x1c;
    }
  }
  _local_50 = CONCAT62(0x1f1f1e1f1e1f,CONCAT11(bVar4,0x1f));
  local_58 = -1;
  if (((((0 < Day) && (0xfffffffffffffff3 < Month - 0xdU)) && (0xffffffffffffffbb < uVar5 - 0x7f6))
      && (((ulong)Seconds < 0x3c && ((ulong)Minutes < 0x3c)))) &&
     (((ulong)Hours < 0x18 && (Day <= local_50[Month - 1U & 0xffffffff])))) {
    lVar1 = Day + -1;
    if (1 < Month) {
      uVar2 = 0;
      do {
        lVar1 = lVar1 + local_50[uVar2];
        uVar2 = uVar2 + 1;
      } while (Month - 1U != uVar2);
    }
    if (0x7b2 < (long)uVar5) {
      uVar2 = 0x7b2;
      do {
        lVar1 = lVar1 + 0x16d + (ulong)((uVar2 & 3) == 0);
        uVar2 = uVar2 + 1;
      } while (uVar5 != uVar2);
    }
    local_58 = Minutes * 0x3c + Hours * 0xe10 + Seconds + Timezone + lVar1 * 0x15180;
    ptVar3 = localtime_r(&local_58,&local_40);
    if ((DSTmode == DSTon) || ((DSTmode == DSTmaybe && (ptVar3->tm_isdst != 0)))) {
      local_58 = local_58 + -0xe10;
    }
  }
  return local_58;
}

Assistant:

static time_t
Convert(time_t Month, time_t Day, time_t Year,
	time_t Hours, time_t Minutes, time_t Seconds,
	time_t Timezone, enum DSTMODE DSTmode)
{
	signed char DaysInMonth[12] = {
		31, 0, 31, 30, 31, 30, 31, 31, 30, 31, 30, 31
	};
	time_t		Julian;
	int		i;
	struct tm	*ltime;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE_LOCALTIME_S)
	struct tm	tmbuf;
#endif

	if (Year < 69)
		Year += 2000;
	else if (Year < 100)
		Year += 1900;
	DaysInMonth[1] = Year % 4 == 0 && (Year % 100 != 0 || Year % 400 == 0)
	    ? 29 : 28;
	/* Checking for 2038 bogusly assumes that time_t is 32 bits.  But
	   I'm too lazy to try to check for time_t overflow in another way.  */
	if (Year < EPOCH || Year >= 2038
	    || Month < 1 || Month > 12
	    /* Lint fluff:  "conversion from long may lose accuracy" */
	    || Day < 1 || Day > DaysInMonth[(int)--Month]
	    || Hours < 0 || Hours > 23
	    || Minutes < 0 || Minutes > 59
	    || Seconds < 0 || Seconds > 59)
		return -1;

	Julian = Day - 1;
	for (i = 0; i < Month; i++)
		Julian += DaysInMonth[i];
	for (i = EPOCH; i < Year; i++)
		Julian += 365 + (i % 4 == 0);
	Julian *= DAY;
	Julian += Timezone;
	Julian += Hours * HOUR + Minutes * MINUTE + Seconds;
#if defined(HAVE_LOCALTIME_S)
	ltime = localtime_s(&tmbuf, &Julian) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
	ltime = localtime_r(&Julian, &tmbuf);
#else
	ltime = localtime(&Julian);
#endif
	if (DSTmode == DSTon
	    || (DSTmode == DSTmaybe && ltime->tm_isdst))
		Julian -= HOUR;
	return Julian;
}